

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

void __thiscall
TTD::ExecutionInfoManager::SetPendingTTDToTarget
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *dsl)

{
  int64 iVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  
  iVar1 = dsl->m_bpId;
  (this->m_pendingTTDBP).m_sourceScriptLogId = dsl->m_sourceScriptLogId;
  (this->m_pendingTTDBP).m_bpId = iVar1;
  iVar1 = dsl->m_ftime;
  (this->m_pendingTTDBP).m_etime = dsl->m_etime;
  (this->m_pendingTTDBP).m_ftime = iVar1;
  (this->m_pendingTTDBP).m_ltime = dsl->m_ltime;
  uVar2 = dsl->m_functionLine;
  uVar3 = dsl->m_functionColumn;
  uVar4 = dsl->m_line;
  (this->m_pendingTTDBP).m_topLevelBodyId = dsl->m_topLevelBodyId;
  (this->m_pendingTTDBP).m_functionLine = uVar2;
  (this->m_pendingTTDBP).m_functionColumn = uVar3;
  (this->m_pendingTTDBP).m_line = uVar4;
  (this->m_pendingTTDBP).m_column = dsl->m_column;
  this->m_pendingTTDMoveMode = 0;
  return;
}

Assistant:

void ExecutionInfoManager::SetPendingTTDToTarget(const TTDebuggerSourceLocation& dsl)
    {
        this->m_pendingTTDBP.SetLocationCopy(dsl);

        this->m_pendingTTDMoveMode = 0;
    }